

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall sznet::net::Buffer::Buffer(Buffer *this,size_t nCheapPrepend,size_t initialSize)

{
  pointer pcVar1;
  allocator_type local_21;
  
  this->m_nCheapPrepend = nCheapPrepend;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->m_buffer,nCheapPrepend + initialSize,&local_21);
  this->m_readerIndex = nCheapPrepend;
  this->m_writerIndex = nCheapPrepend;
  pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->m_wrapSize =
       (ulong)(((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage - (long)pcVar1) * 3) >> 2;
  if (initialSize == 0) {
    __assert_fail("initialSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0x31,"sznet::net::Buffer::Buffer(size_t, size_t)");
  }
  if ((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)(pcVar1 + nCheapPrepend) == initialSize) {
    return;
  }
  __assert_fail("writableBytes() == initialSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0x34,"sznet::net::Buffer::Buffer(size_t, size_t)");
}

Assistant:

explicit Buffer(size_t nCheapPrepend = kCheapPrepend, size_t initialSize = kInitialSize):
		m_nCheapPrepend(nCheapPrepend),
		m_buffer(nCheapPrepend + initialSize),
		m_readerIndex(nCheapPrepend),
		m_writerIndex(nCheapPrepend),
		m_wrapSize(m_buffer.capacity() * 3 / 4)
	{
		assert(initialSize > 0);
		assert(nCheapPrepend >= 0);
		assert(readableBytes() == 0);
		assert(writableBytes() == initialSize);
		assert(prependableBytes() == nCheapPrepend);
	}